

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int-view.h
# Opt level: O0

int64_t __thiscall IntView<2>::getMin(IntView<2> *this)

{
  int iVar1;
  long in_RDI;
  int64_t v;
  
  iVar1 = IntVar::getMin((IntVar *)0x26632a);
  return (long)*(int *)(in_RDI + 8) * (long)iVar1;
}

Assistant:

int64_t getMin() const {
		int64_t v = (type & 1) != 0 ? -var->getMax() : var->getMin();
		if ((type & 2) != 0) {
			v *= a;
		}
		if ((type & 4) != 0) {
			v += b;
		}
		return v;
	}